

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

uint __thiscall
glslang::TIntermediate::computeTypeXfbSize
          (TIntermediate *this,TType *type,bool *contains64BitType,bool *contains32BitType,
          bool *contains16BitType)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool *contains32BitType_00;
  undefined7 uVar5;
  bool memberContains16BitType;
  bool memberContains32BitType;
  bool memberContains64BitType;
  TType elementType;
  bool local_ef;
  bool local_ee;
  bool local_ed;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  bool *local_e0;
  bool *local_d8;
  bool *local_d0;
  TType local_c8;
  
  iVar1 = (*type->_vptr_TType[0x1e])(type);
  if ((char)iVar1 == '\0') {
    local_e0 = contains64BitType;
    iVar1 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar1 != '\0') {
      local_d8 = contains32BitType;
      local_d0 = contains16BitType;
      iVar1 = (*type->_vptr_TType[0x25])(type);
      if ((char)iVar1 != '\0') {
        iVar1 = 0;
        local_ec = 0;
        local_e8 = 0;
        local_e4 = 0;
        uVar2 = 0;
        do {
          if ((int)((ulong)((long)(((type->field_13).referentType)->qualifier).semanticName -
                           *(long *)&((type->field_13).referentType)->field_0x8) >> 5) <= iVar1) {
            if ((local_e4 & 1) != 0) {
              *local_e0 = true;
              return uVar2 + 7 & 0xfffffff8;
            }
            if ((local_e8 & 1) != 0) {
              *local_d8 = true;
              return uVar2 + 3 & 0xfffffffc;
            }
            if ((local_ec & 1) == 0) {
              return uVar2;
            }
            *local_d0 = true;
            return uVar2 + 1 & 0xfffffffe;
          }
          TType::TType(&local_c8,type,iVar1,false);
          local_ed = false;
          local_ee = false;
          local_ef = false;
          contains32BitType_00 = &local_ee;
          uVar3 = computeTypeXfbSize(this,&local_c8,&local_ed,contains32BitType_00,&local_ef);
          uVar5 = (undefined7)((ulong)contains32BitType_00 >> 8);
          if (local_ed == true) {
            uVar2 = uVar2 + 7 & 0xfffffff8;
            local_e4 = (uint)CONCAT71(uVar5,1);
          }
          else if (local_ee == true) {
            uVar2 = uVar2 + 3 & 0xfffffffc;
            local_e8 = (uint)CONCAT71(uVar5,1);
          }
          else if (local_ef == true) {
            uVar2 = uVar2 + 1 & 0xfffffffe;
            local_ec = (uint)CONCAT71(uVar5,1);
          }
          uVar2 = uVar2 + uVar3;
          iVar1 = iVar1 + 1;
          iVar4 = (*type->_vptr_TType[0x25])(type);
        } while ((char)iVar4 != '\0');
      }
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    iVar1 = (*type->_vptr_TType[0x18])(type);
    uVar2 = 1;
    if ((char)iVar1 == '\0') {
      iVar1 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar1 == '\0') {
        iVar1 = (*type->_vptr_TType[0x1c])(type);
        if ((char)iVar1 == '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                        ,0x865,
                        "unsigned int glslang::TIntermediate::computeTypeXfbSize(const TType &, bool &, bool &, bool &) const"
                       );
        }
        iVar1 = (*type->_vptr_TType[0xd])(type);
        iVar4 = (*type->_vptr_TType[0xe])(type);
        uVar2 = iVar4 * iVar1;
      }
      else {
        uVar2 = (*type->_vptr_TType[0xc])();
      }
    }
    iVar1 = (*type->_vptr_TType[7])(type);
    if (((iVar1 != 2) && (iVar1 = (*type->_vptr_TType[7])(type), iVar1 != 10)) &&
       (iVar1 = (*type->_vptr_TType[7])(type), iVar1 != 0xb)) {
      iVar1 = (*type->_vptr_TType[7])(type);
      if (((iVar1 == 3) || (iVar1 = (*type->_vptr_TType[7])(type), iVar1 == 6)) ||
         (iVar1 = (*type->_vptr_TType[7])(type), iVar1 == 7)) {
        *contains16BitType = true;
        return uVar2 * 2;
      }
      iVar1 = (*type->_vptr_TType[7])(type);
      if (iVar1 == 4) {
        return uVar2;
      }
      iVar1 = (*type->_vptr_TType[7])(type);
      if (iVar1 == 5) {
        return uVar2;
      }
      *contains32BitType = true;
      return uVar2 << 2;
    }
    *local_e0 = true;
    uVar2 = uVar2 << 3;
  }
  else {
    TType::TType(&local_c8,type,0,false);
    iVar1 = (*type->_vptr_TType[0xf])(type);
    uVar2 = computeTypeXfbSize(this,&local_c8,contains64BitType,contains16BitType,contains16BitType)
    ;
    uVar2 = uVar2 * iVar1;
  }
  return uVar2;
}

Assistant:

unsigned int TIntermediate::computeTypeXfbSize(const TType& type, bool& contains64BitType, bool& contains32BitType, bool& contains16BitType) const
{
    // "...if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8,
    // and the space taken in the buffer will be a multiple of 8.
    // ...within the qualified entity, subsequent components are each
    // assigned, in order, to the next available offset aligned to a multiple of
    // that component's size.  Aggregate types are flattened down to the component
    // level to get this sequence of components."

    if (type.isSizedArray()) {
        // TODO: perf: this can be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        // Unsized array use to xfb should be a compile error.
        TType elementType(type, 0);
        return type.getOuterArraySize() * computeTypeXfbSize(elementType, contains64BitType, contains16BitType, contains16BitType);
    }

    if (type.isStruct()) {
        unsigned int size = 0;
        bool structContains64BitType = false;
        bool structContains32BitType = false;
        bool structContains16BitType = false;
        for (int member = 0; member < (int)type.getStruct()->size(); ++member) {
            TType memberType(type, member);
            // "... if applied to
            // an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8,
            // and the space taken in the buffer will be a multiple of 8."
            bool memberContains64BitType = false;
            bool memberContains32BitType = false;
            bool memberContains16BitType = false;
            int memberSize = computeTypeXfbSize(memberType, memberContains64BitType, memberContains32BitType, memberContains16BitType);
            if (memberContains64BitType) {
                structContains64BitType = true;
                RoundToPow2(size, 8);
            } else if (memberContains32BitType) {
                structContains32BitType = true;
                RoundToPow2(size, 4);
            } else if (memberContains16BitType) {
                structContains16BitType = true;
                RoundToPow2(size, 2);
            }
            size += memberSize;
        }

        if (structContains64BitType) {
            contains64BitType = true;
            RoundToPow2(size, 8);
        } else if (structContains32BitType) {
            contains32BitType = true;
            RoundToPow2(size, 4);
        } else if (structContains16BitType) {
            contains16BitType = true;
            RoundToPow2(size, 2);
        }
        return size;
    }

    int numComponents {0};
    if (type.isScalar())
        numComponents = 1;
    else if (type.isVector())
        numComponents = type.getVectorSize();
    else if (type.isMatrix())
        numComponents = type.getMatrixCols() * type.getMatrixRows();
    else {
        assert(0);
        numComponents = 1;
    }

    if (type.getBasicType() == EbtDouble || type.getBasicType() == EbtInt64 || type.getBasicType() == EbtUint64) {
        contains64BitType = true;
        return 8 * numComponents;
    } else if (type.getBasicType() == EbtFloat16 || type.getBasicType() == EbtInt16 || type.getBasicType() == EbtUint16) {
        contains16BitType = true;
        return 2 * numComponents;
    } else if (type.getBasicType() == EbtInt8 || type.getBasicType() == EbtUint8)
        return numComponents;
    else {
        contains32BitType = true;
        return 4 * numComponents;
    }
}